

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O0

int CRYPTO_memcmp(void *in_a,void *in_b,size_t len)

{
  undefined8 local_40;
  size_t i;
  uint8_t x;
  uint8_t *b;
  uint8_t *a;
  size_t len_local;
  void *in_b_local;
  void *in_a_local;
  
  i._7_1_ = 0;
  for (local_40 = 0; local_40 < len; local_40 = local_40 + 1) {
    i._7_1_ = i._7_1_ | *(byte *)((long)in_a + local_40) ^ *(byte *)((long)in_b + local_40);
  }
  return (int)i._7_1_;
}

Assistant:

int CRYPTO_memcmp(const void *in_a, const void *in_b, size_t len) {
  const uint8_t *a = reinterpret_cast<const uint8_t *>(in_a);
  const uint8_t *b = reinterpret_cast<const uint8_t *>(in_b);
  uint8_t x = 0;

  for (size_t i = 0; i < len; i++) {
    x |= a[i] ^ b[i];
  }

  return x;
}